

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  String local_60;
  String local_40;
  
  if (this->cs_ != None) {
    bVar2 = Value::hasComment(root,commentAfterOnSameLine);
    if (bVar2) {
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x792446);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_60.field_2._M_allocated_capacity = *psVar4;
        local_60.field_2._8_8_ = plVar3[3];
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      }
      else {
        local_60.field_2._M_allocated_capacity = *psVar4;
        local_60._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_60._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = Value::hasComment(root,commentAfter);
    if (bVar2) {
      writeIndent(this);
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_60,root,commentAfter);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(
    Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}